

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>,false>
          (Thread *this)

{
  long lVar1;
  Simd<int,_(unsigned_char)__x04_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  int aiStack_48 [4];
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  aiStack_48[2] = 0x133ca3;
  aiStack_48[3] = 0;
  local_18.v128_.v = (v128)Pop(this);
  aiStack_48[2] = 0x133cb5;
  aiStack_48[3] = 0;
  local_28.v128_.v = (v128)Pop(this);
  lVar1 = 8;
  do {
    *(int *)((long)aiStack_48 + lVar1 * 2) =
         (int)*(short *)((long)&local_18 + lVar1) * (int)*(short *)((long)&local_28 + lVar1);
    lVar1 = lVar1 + 2;
  } while (lVar1 != 0x10);
  aiStack_48[2] = 0x133cf0;
  aiStack_48[3] = 0;
  Push(this,(Value)local_38.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}